

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O3

int Fraig_MarkTfi_rec(Fraig_Man_t *pMan,Fraig_Node_t *pNode)

{
  int iVar1;
  int iVar2;
  
  iVar1 = pMan->nTravIds;
  iVar2 = 0;
  if (pNode->TravId != iVar1) {
    iVar2 = 0;
    do {
      pNode->TravId = iVar1;
      if (-1 < pNode->NumPi) {
        iVar1 = 1;
        goto LAB_005f1e3d;
      }
      iVar1 = Fraig_MarkTfi_rec(pMan,(Fraig_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe));
      pNode = (Fraig_Node_t *)((ulong)pNode->p2 & 0xfffffffffffffffe);
      iVar2 = iVar2 + iVar1;
      iVar1 = pMan->nTravIds;
    } while (pNode->TravId != iVar1);
    iVar1 = 0;
LAB_005f1e3d:
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Fraig_MarkTfi_rec( Fraig_Man_t * pMan, Fraig_Node_t * pNode )
{
    // skip the visited node
    if ( pNode->TravId == pMan->nTravIds )
        return 0;
    pNode->TravId = pMan->nTravIds;
    // skip the PI node
    if ( pNode->NumPi >= 0 )
        return 1;
    // check the children
    return Fraig_MarkTfi_rec( pMan, Fraig_Regular(pNode->p1) ) +
           Fraig_MarkTfi_rec( pMan, Fraig_Regular(pNode->p2) );
}